

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall QSslSocket::waitForDisconnected(QSslSocket *this,int msecs)

{
  bool bVar1;
  byte bVar2;
  SocketState SVar3;
  int iVar4;
  undefined4 uVar5;
  QSslSocketPrivate *pQVar6;
  int in_ESI;
  QSslSocket *in_RDI;
  long in_FS_OFFSET;
  bool retVal;
  QSslSocketPrivate *d;
  QElapsedTimer stopWatch;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff48;
  SocketState in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  QTcpSocket *pQVar7;
  bool local_61;
  QElapsedTimer local_48;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QSslSocket *)0x3a33f4);
  SVar3 = QAbstractSocket::state((QAbstractSocket *)0x3a3403);
  if (SVar3 == UnconnectedState) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a345f);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                 (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (char *)0x3a3478);
      QMessageLogger::warning
                (local_38,"QSslSocket::waitForDisconnected() is not allowed in UnconnectedState");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    local_61 = false;
  }
  else if (pQVar6->plainSocket == (QTcpSocket *)0x0) {
    local_61 = false;
  }
  else if ((pQVar6->mode == UnencryptedMode) && ((pQVar6->autoStartHandshake & 1U) == 0)) {
    bVar2 = (**(code **)(*(long *)&pQVar6->plainSocket->super_QAbstractSocket + 0x138))
                      (pQVar6->plainSocket,in_ESI);
    local_61 = (bool)(bVar2 & 1);
  }
  else {
    local_48.t1 = -0x5555555555555556;
    local_48.t2 = -0x5555555555555556;
    QElapsedTimer::QElapsedTimer(&local_48);
    QElapsedTimer::start();
    if (((pQVar6->connectionEncrypted & 1U) != 0) || (bVar1 = waitForEncrypted(in_RDI,iVar4), bVar1)
       ) {
      bVar1 = QIODevicePrivate::QRingBufferRef::isEmpty
                        ((QRingBufferRef *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (!bVar1) {
        QSslSocketPrivate::transmit
                  ((QSslSocketPrivate *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      SVar3 = QAbstractSocket::state((QAbstractSocket *)0x3a357c);
      if (SVar3 == UnconnectedState) {
        local_61 = true;
      }
      else {
        pQVar7 = pQVar6->plainSocket;
        iVar4 = QElapsedTimer::elapsed();
        uVar5 = qt_subtract_from_timeout(in_ESI,iVar4);
        bVar2 = (**(code **)(*(long *)&pQVar7->super_QAbstractSocket + 0x138))(pQVar7,uVar5);
        local_61 = (bool)(bVar2 & 1);
        if (local_61 == false) {
          QAbstractSocket::state((QAbstractSocket *)0x3a35e7);
          QAbstractSocket::setSocketState
                    ((QAbstractSocket *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
          QAbstractSocket::error((QAbstractSocket *)0x3a360e);
          QIODevice::errorString();
          QAbstractSocketPrivate::setError
                    ((QAbstractSocketPrivate *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,(QString *)0x3a363b);
          QString::~QString((QString *)0x3a3645);
        }
      }
    }
    else {
      local_61 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QSslSocket::waitForDisconnected(int msecs)
{
    Q_D(QSslSocket);

    // require calling connectToHost() before waitForDisconnected()
    if (state() == UnconnectedState) {
        qCWarning(lcSsl, "QSslSocket::waitForDisconnected() is not allowed in UnconnectedState");
        return false;
    }

    if (!d->plainSocket)
        return false;
    // Forward to the plain socket unless the connection is secure.
    if (d->mode == UnencryptedMode && !d->autoStartHandshake)
        return d->plainSocket->waitForDisconnected(msecs);

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (!d->connectionEncrypted) {
        // Wait until we've entered encrypted mode, or until a failure occurs.
        if (!waitForEncrypted(msecs))
            return false;
    }
    // We are delaying the disconnect, if the write buffer is not empty.
    // So, start the transmission.
    if (!d->writeBuffer.isEmpty())
        d->transmit();

    // At this point, the socket might be disconnected, if disconnectFromHost()
    // was called just after the connectToHostEncrypted() call. Also, we can
    // lose the connection as a result of the transmit() call.
    if (state() == UnconnectedState)
        return true;

    bool retVal = d->plainSocket->waitForDisconnected(qt_subtract_from_timeout(msecs, stopWatch.elapsed()));
    if (!retVal) {
        setSocketState(d->plainSocket->state());
        d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    }
    return retVal;
}